

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O3

void __thiscall
chrono::ChFrame<double>::TransformLocalToParent
          (ChFrame<double> *this,ChFrame<double> *local,ChFrame<double> *parent)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ChQuaternion<double> q;
  ChVector<double> CStack_58;
  ChQuaternion<double> local_40;
  
  ChTransform<double>::TransformLocalToParent(&(local->coord).pos,&(this->coord).pos,&this->Amatrix)
  ;
  dVar1 = (this->coord).rot.m_data[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  auVar4 = *(undefined1 (*) [32])(local->coord).rot.m_data;
  auVar3 = *(undefined1 (*) [16])((this->coord).rot.m_data + 2);
  dVar2 = (local->coord).rot.m_data[1];
  auVar14._24_8_ = dVar2;
  auVar14._16_8_ = dVar2;
  auVar5 = vpermpd_avx2(*(undefined1 (*) [32])((local->coord).rot.m_data + 2),0x15);
  auVar12._0_8_ = -dVar1;
  auVar12._8_8_ = 0x8000000000000000;
  auVar6 = vpermpd_avx2(auVar4,1);
  auVar10._0_8_ = -auVar3._0_8_;
  auVar10._8_8_ = -auVar3._8_8_;
  auVar8 = vunpcklpd_avx(auVar12,auVar8);
  auVar9._16_16_ = auVar3;
  auVar9._0_16_ = auVar8;
  auVar7._0_8_ = auVar6._0_8_ * auVar8._0_8_;
  auVar7._8_8_ = auVar6._8_8_ * auVar8._8_8_;
  auVar7._16_8_ = auVar6._16_8_ * auVar3._0_8_;
  auVar7._24_8_ = auVar6._24_8_ * auVar3._8_8_;
  dVar1 = (this->coord).rot.m_data[0];
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  auVar6._16_8_ = dVar1;
  auVar6._24_8_ = dVar1;
  auVar7 = vfmadd231pd_avx512vl(auVar7,auVar4,auVar6);
  dVar1 = (this->coord).rot.m_data[3];
  auVar13._24_8_ = dVar1;
  auVar13._16_8_ = dVar1;
  dVar1 = (local->coord).rot.m_data[2];
  auVar14._8_8_ = dVar1;
  auVar14._0_8_ = dVar1;
  auVar4 = vpermpd_avx2(auVar9,0x66);
  auVar13._0_16_ = auVar10;
  auVar11._16_16_ = auVar12;
  auVar11._0_16_ = auVar10;
  auVar4 = vshufpd_avx(auVar11,auVar4,9);
  auVar6 = vpermpd_avx2(auVar13,0x24);
  auVar3 = vfmadd213pd_fma(auVar14,auVar6,auVar7);
  auVar3 = vfmadd213pd_fma(auVar4,auVar5,ZEXT1632(auVar3));
  local_40.m_data = (double  [4])ZEXT1632(auVar3);
  SetCoord(parent,&CStack_58,&local_40);
  return;
}

Assistant:

void TransformLocalToParent(
        const ChFrame<Real>& local,  ///< frame to transform, given in local frame coordinates
        ChFrame<Real>& parent        ///< transformed frame, in parent coordinates, will be stored here
        ) const {
        parent.SetCoord(TransformLocalToParent(local.coord.pos), coord.rot % local.coord.rot);
    }